

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O2

void mk_print(int type,char *format,...)

{
  char in_AL;
  int iVar1;
  tm *ptVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *pcVar3;
  uint uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  char *pcVar5;
  char *pcVar6;
  undefined *puVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  time_t now;
  tm result;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  args[0].reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  uVar4 = type - 0x1000;
  if (uVar4 < 4) {
    pcVar6 = &DAT_001174e4 + *(int *)(&DAT_001174e4 + (ulong)uVar4 * 4);
    puVar7 = &DAT_001174f4 + *(int *)(&DAT_001174f4 + (ulong)uVar4 * 4);
  }
  else {
    pcVar6 = (char *)0x0;
    puVar7 = (undefined *)0x0;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = isatty(1);
  if (iVar1 == 0) {
    pcVar6 = "";
    pcVar3 = "";
    __s = "";
    pcVar5 = "";
  }
  else {
    pcVar5 = "\x1b[97m";
    __s = "\x1b[0m";
    pcVar3 = "\x1b[1m";
  }
  now = time((time_t *)0x0);
  ptVar2 = localtime_r(&now,(tm *)&result);
  printf("%s[%s%i/%02i/%02i %02i:%02i:%02i%s]%s ",pcVar3,__s,(ulong)(ptVar2->tm_year + 0x76c),
         (ulong)(ptVar2->tm_mon + 1),(ulong)(uint)ptVar2->tm_mday,(ulong)(uint)ptVar2->tm_hour,
         (ulong)(uint)ptVar2->tm_min,(ulong)(uint)ptVar2->tm_sec,pcVar3,__s);
  printf("%s[%s%7s%s]%s ",pcVar3,pcVar6,puVar7,pcVar5,__s);
  vprintf(format,args);
  puts(__s);
  fflush(_stdout);
  return;
}

Assistant:

void mk_print(int type, const char *format, ...)
{
    time_t now;
    struct tm *current;

    const char *header_color = NULL;
    const char *header_title = NULL;
    const char *bold_color = ANSI_BOLD;
    const char *reset_color = ANSI_RESET;
    const char *white_color = ANSI_WHITE;
    va_list args;

    va_start(args, format);

    switch (type) {
    case MK_INFO:
        header_title = "Info";
        header_color = ANSI_GREEN;
        break;
    case MK_ERR:
        header_title = "Error";
        header_color = ANSI_RED;
        break;
    case MK_WARN:
        header_title = "Warning";
        header_color = ANSI_YELLOW;
        break;
    case MK_BUG:
#ifdef DEBUG
        mk_utils_stacktrace();
#endif
        header_title = " BUG !";
        header_color = ANSI_BOLD ANSI_RED;
        break;
    }

    /* Only print colors to a terminal */
    if (!isatty(STDOUT_FILENO)) {
        header_color = "";
        bold_color = "";
        reset_color = "";
        white_color = "";
    }

    now = time(NULL);
    struct tm result;
    current = localtime_r(&now, &result);
    printf("%s[%s%i/%02i/%02i %02i:%02i:%02i%s]%s ",
           bold_color, reset_color,
           current->tm_year + 1900,
           current->tm_mon + 1,
           current->tm_mday,
           current->tm_hour,
           current->tm_min,
           current->tm_sec,
           bold_color, reset_color);

    printf("%s[%s%7s%s]%s ",
           bold_color, header_color, header_title, white_color, reset_color);

    vprintf(format, args);
    va_end(args);
    printf("%s\n", reset_color);
    fflush(stdout);
}